

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall cursespp::App::OnResized(App *this)

{
  IWindow *pIVar1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = Screen::GetWidth();
  iVar4 = Screen::GetHeight();
  if ((iVar3 < this->minWidth) || (iVar4 < this->minHeight)) {
    Window::Freeze();
    return;
  }
  Window::Unfreeze();
  if ((this->state).layout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    pIVar1 = (this->state).rootWindow;
    if (pIVar1 != (IWindow *)0x0) {
      uVar5 = Screen::GetWidth();
      uVar6 = Screen::GetHeight();
      (*(pIVar1->super_IOrderable)._vptr_IOrderable[0x15])(pIVar1,0,0,(ulong)uVar5,(ulong)uVar6);
    }
    (*(((this->state).layout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_IWindowGroup)._vptr_IWindowGroup[0x12])();
    peVar2 = (this->state).layout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar2->super_IOrderable)._vptr_IOrderable[2])(&peVar2->super_IOrderable);
  }
  peVar2 = (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 != (element_type *)0x0) {
    (*(peVar2->super_IWindowGroup)._vptr_IWindowGroup[0x12])();
    peVar2 = (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar2->super_IOrderable)._vptr_IOrderable[2])(&peVar2->super_IOrderable);
    return;
  }
  return;
}

Assistant:

void App::OnResized() {
    int cx = Screen::GetWidth();
    int cy = Screen::GetHeight();
    if (cx < this->minWidth || cy < this->minHeight) {
        Window::Freeze();
    }
    else {
        Window::Unfreeze();

        if (this->state.layout) {
            if (this->state.rootWindow) {
                this->state.rootWindow->MoveAndResize(
                    0, 0, Screen::GetWidth(), Screen::GetHeight());
            }

            this->state.layout->Layout();
            this->state.layout->BringToTop();
        }

        if (this->state.overlay) {
            this->state.overlay->Layout();
            this->state.overlay->BringToTop();
        }
    }
}